

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O0

int __thiscall
bdHashSpace::search(bdHashSpace *this,bdNodeId *id,string *key,uint32_t maxAge,
                   list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries)

{
  bool bVar1;
  pointer ppVar2;
  string local_70;
  _Self local_50;
  _Base_ptr local_48;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_> local_40;
  iterator it;
  list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries_local;
  uint32_t maxAge_local;
  string *key_local;
  bdNodeId *id_local;
  bdHashSpace *this_local;
  
  it._M_node = (_Base_ptr)entries;
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_>::_Rb_tree_iterator(&local_40);
  local_48 = (_Base_ptr)
             std::
             map<bdNodeId,_bdHashSet,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
             ::find(&this->mHashTable,id);
  local_40._M_node = local_48;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<bdNodeId,_bdHashSet,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
       ::end(&this->mHashTable);
  bVar1 = std::operator==(&local_40,&local_50);
  if (bVar1) {
    this_local._4_4_ = 1;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_>::operator->(&local_40);
    std::__cxx11::string::string((string *)&local_70,(string *)key);
    this_local._4_4_ =
         bdHashSet::search(&ppVar2->second,&local_70,maxAge,
                           (list<bdHashEntry,_std::allocator<bdHashEntry>_> *)it._M_node);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return this_local._4_4_;
}

Assistant:

int 	bdHashSpace::search(bdNodeId *id, std::string key, uint32_t maxAge, std::list<bdHashEntry> &entries) {
	std::map<bdNodeId, bdHashSet>::iterator it;
	it = mHashTable.find(*id);
	if (it == mHashTable.end()) 
	{
		/* no entry */
		return 1;
	}

	return it->second.search(key, maxAge, entries);
}